

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionmenuitems.h
# Opt level: O2

bool __thiscall FOptionMenuItemSafeCommand::Activate(FOptionMenuItemSafeCommand *this)

{
  char *pcVar1;
  char *pcVar2;
  BYTE *pBVar3;
  BYTE *pBVar4;
  FString FullString;
  FString local_20;
  FName local_14;
  
  pcVar1 = (this->mPrompt).Chars;
  pcVar2 = "$SAFEMESSAGE";
  if (*(int *)(pcVar1 + -0xc) != 0) {
    pcVar2 = pcVar1;
  }
  if (*pcVar2 == '$') {
    pcVar2 = FStringTable::operator()(&GStrings,pcVar2 + 1);
  }
  pBVar3 = (BYTE *)(this->super_FOptionMenuItemCommand).super_FOptionMenuItemSubmenu.
                   super_FOptionMenuItem.mLabel.Chars;
  if (pBVar3 == (BYTE *)0x0) {
    pBVar3 = (BYTE *)0x0;
  }
  else if (*pBVar3 == '$') {
    pBVar3 = (BYTE *)FStringTable::operator()(&GStrings,(char *)(pBVar3 + 1));
  }
  local_20.Chars = FString::NullString.Nothing;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  pBVar4 = "";
  if (pBVar3 != (BYTE *)0x0) {
    pBVar4 = pBVar3;
  }
  FString::Format(&local_20,"\x1cJ%s\x1c-\n\n%s",pBVar4,pcVar2);
  if ((pcVar2 != (char *)0x0) && (local_20.Chars != (char *)0x0)) {
    local_14.Index = 0;
    M_StartMessage(local_20.Chars,0,&local_14);
  }
  FString::~FString(&local_20);
  return true;
}

Assistant:

bool Activate()
	{
		const char *msg = mPrompt.IsNotEmpty() ? mPrompt.GetChars() : "$SAFEMESSAGE";
		if (*msg == '$')
		{
			msg = GStrings(msg + 1);
		}

		const char *actionLabel = mLabel.GetChars();
		if (actionLabel != NULL)
		{
			if (*actionLabel == '$')
			{
				actionLabel = GStrings(actionLabel + 1);
			}
		}

		FString FullString;
		FullString.Format(TEXTCOLOR_WHITE "%s" TEXTCOLOR_NORMAL "\n\n" "%s", actionLabel != NULL ? actionLabel : "", msg);

		if (msg && FullString) M_StartMessage(FullString, 0);
		return true;
	}